

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

bool stringToInt(string *line,size_t start,size_t end,int64_t *result)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  
  pcVar1 = (line->_M_dataplus)._M_p;
  if (pcVar1[start] == '0') {
    iVar2 = tolower((int)pcVar1[start + 1]);
    if (iVar2 == 0x62) {
      iVar2 = tolower((int)pcVar1[end - 1]);
      if (iVar2 == 0x68) goto LAB_00151cfd;
      uVar3 = 2;
    }
    else if (iVar2 == 0x6f) {
      uVar3 = 8;
    }
    else {
      if (iVar2 != 0x78) goto LAB_00151cfd;
      uVar3 = 0x10;
    }
    start = start + 2;
    sVar6 = end;
  }
  else {
LAB_00151cfd:
    sVar6 = end - 1;
    iVar2 = tolower((int)pcVar1[end - 1]);
    if (iVar2 == 0x62) {
      uVar3 = 2;
    }
    else if (iVar2 == 0x68) {
      uVar3 = 0x10;
    }
    else {
      if (iVar2 == 0x6f) {
        end = sVar6;
      }
      uVar3 = (uint)(iVar2 != 0x6f) * 2 + 8;
      sVar6 = end;
    }
  }
  lVar5 = 0;
  for (; *result = lVar5, start < sVar6; start = start + 1) {
    iVar4 = tolower((int)pcVar1[start]);
    iVar2 = iVar4 + -0x57;
    if (iVar4 < 0x61) {
      iVar2 = iVar4 + -0x30;
    }
    if ((int)uVar3 <= iVar2) break;
    lVar5 = lVar5 * (ulong)uVar3 + (long)iVar2;
  }
  return sVar6 <= start;
}

Assistant:

bool stringToInt(const std::string& line, size_t start, size_t end, int64_t& result)
{
	// find base of number
	int32_t base = 10;
	if (line[start] == '0')
	{
		if (tolower(line[start+1]) == 'x')
		{
			base = 16;
			start += 2;
		} else if (tolower(line[start+1]) == 'o')
		{
			base = 8;
			start += 2;
		} else if (tolower(line[start+1]) == 'b' && tolower(line[end-1]) != 'h')
		{
			base = 2;
			start += 2;
		}
	}

	if (base == 10)
	{
		if (tolower(line[end-1]) == 'h')
		{
			base = 16;
			end--;
		} else if (tolower(line[end-1]) == 'b')
		{
			base = 2;
			end--;
		} else if (tolower(line[end-1]) == 'o')
		{
			base = 8;
			end--;
		}
	}

	// convert number
	result = 0;
	while (start < end)
	{
		int c = tolower(line[start++]);

		int32_t value = c >= 'a' ? c-'a'+10 : c-'0';

		if (value >= base)
			return false;

		result = (result*base) + value;
	}

	return true;
}